

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ROIAlign_x86_avx::forward
          (ROIAlign_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pMVar4;
  Mat *this_00;
  _func_int **pp_Var5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  _func_int *p_Var11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [12];
  undefined1 in_ZMM5 [64];
  undefined1 auVar36 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  allocator_type local_105;
  int local_104;
  int local_100;
  int local_fc;
  void *local_f8;
  void *local_f0;
  undefined1 local_e8 [16];
  void *local_d0;
  ulong local_c8;
  _func_int **local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Mat *local_90;
  ROIAlign_x86_avx *local_88;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  undefined1 auVar37 [64];
  
  auVar35 = in_ZMM5._4_12_;
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar10 = pMVar4->w;
  iVar16 = pMVar4->h;
  local_f0 = (void *)(ulong)(uint)pMVar4->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx[-3]),pMVar4->c,
              pMVar4->elemsize,opt->blob_allocator);
  iVar13 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var5 = this->_vptr_ROIAlign_x86_avx;
    p_Var11 = pp_Var5[-3];
    fVar31 = *(float *)(&this->field_0xd8 + (long)p_Var11);
    uVar2 = *pMVar4[1].data;
    uVar3 = *(undefined8 *)((long)pMVar4[1].data + 8);
    local_a8._0_4_ = fVar31 * (float)uVar2;
    local_a8._4_4_ = fVar31 * (float)((ulong)uVar2 >> 0x20);
    local_a8._8_4_ = fVar31 * 0.0;
    local_a8._12_4_ = fVar31 * 0.0;
    auVar23._0_4_ = (float)uVar3 * fVar31;
    auVar23._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar31;
    auVar23._8_4_ = fVar31 * 0.0;
    auVar23._12_4_ = fVar31 * 0.0;
    bVar22 = (&this->field_0xe0)[(long)p_Var11] != '\0';
    if (bVar22) {
      local_a8._0_4_ = (float)local_a8._0_4_ + -0.5;
      local_a8._4_4_ = local_a8._4_4_ + -0.5;
      local_a8._8_4_ = local_a8._8_4_ + -0.5;
      local_a8._12_4_ = local_a8._12_4_ + -0.5;
      auVar23._0_4_ = auVar23._0_4_ + -0.5;
      auVar23._4_4_ = auVar23._4_4_ + -0.5;
      auVar23._8_4_ = auVar23._8_4_ + -0.5;
      auVar23._12_4_ = auVar23._12_4_ + -0.5;
    }
    auVar23 = vsubps_avx(auVar23,local_a8);
    if (!bVar22) {
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar23 = vmaxps_avx(auVar23,auVar29);
    }
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(&this->field_0xd0 + (long)p_Var11);
    auVar29 = vcvtdq2ps_avx(auVar25);
    auVar25 = vrcpps_avx(auVar29);
    fVar31 = auVar23._0_4_ * auVar25._0_4_;
    fVar32 = auVar23._4_4_ * auVar25._4_4_;
    fVar33 = auVar23._8_4_ * auVar25._8_4_;
    fVar34 = auVar23._12_4_ * auVar25._12_4_;
    auVar26._0_4_ = auVar29._0_4_ * fVar31;
    auVar26._4_4_ = auVar29._4_4_ * fVar32;
    auVar26._8_4_ = auVar29._8_4_ * fVar33;
    auVar26._12_4_ = auVar29._12_4_ * fVar34;
    auVar23 = vsubps_avx(auVar23,auVar26);
    local_b8._0_4_ = fVar31 + auVar25._0_4_ * auVar23._0_4_;
    local_b8._4_4_ = fVar32 + auVar25._4_4_ * auVar23._4_4_;
    local_b8._8_4_ = fVar33 + auVar25._8_4_ * auVar23._8_4_;
    local_b8._12_4_ = fVar34 + auVar25._12_4_ * auVar23._12_4_;
    local_90 = this_00;
    local_88 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var11) == 1) {
      iVar13 = *(int *)(&this->field_0xdc + (long)p_Var11);
      fVar32 = (float)iVar13;
      local_e8 = vmovshdup_avx(local_b8);
      fVar31 = fVar32;
      if (iVar13 < 1) {
        auVar23 = vroundss_avx(local_e8,local_e8,10);
        fVar31 = auVar23._0_4_;
      }
      iVar20 = (int)fVar31;
      if (iVar13 < 1) {
        auVar23 = vroundss_avx(local_b8,local_b8,10);
        fVar32 = auVar23._0_4_;
      }
      iVar13 = (int)fVar32;
      local_104 = iVar20;
      local_100 = iVar16;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)*(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) *
                 (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * (long)iVar20 * (long)iVar13
                 ,&local_105);
      auVar23 = vmovshdup_avx(local_a8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                (local_100,iVar10,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx[-3]),iVar20,iVar13,
                 auVar23._0_4_,local_a8._0_4_,(float)local_e8._0_4_,(float)local_b8._0_4_,iVar20,
                 iVar13,&pre_calc);
      if (0 < (int)local_f0) {
        iVar10 = 1;
        if (1 < local_104 * iVar13) {
          iVar10 = local_104 * iVar13;
        }
        pp_Var5 = this->_vptr_ROIAlign_x86_avx;
        local_f8 = (void *)0x0;
        iVar16 = 0;
        if (0 < iVar13) {
          iVar16 = iVar13;
        }
        local_100 = iVar16 * local_104;
        local_c0 = (_func_int **)pMVar4->data;
        local_c8 = pMVar4->cstep * pMVar4->elemsize;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3])) {
            lVar14 = local_c8 * (long)local_f8;
            local_e8._0_8_ =
                 (void *)(local_90->cstep * (long)local_f8 * local_90->elemsize +
                         (long)local_90->data);
            iVar17 = 0;
            iVar20 = 0;
            do {
              local_fc = iVar20;
              iVar20 = *(int *)(&this->field_0xd0 + (long)pp_Var5[-3]);
              if (0 < iVar20) {
                lVar15 = 0;
                do {
                  if (local_104 < 1) {
                    fVar31 = 0.0;
                  }
                  else {
                    fVar31 = 0.0;
                    iVar21 = 0;
                    iVar20 = iVar17;
                    do {
                      if (0 < iVar13) {
                        pfVar12 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar20].w1;
                        iVar19 = iVar13;
                        do {
                          auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)local_c0 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar12 + -4))->pos1 * 4 +
                                                                   lVar14)),
                                                  ZEXT416(*(uint *)((long)local_c0 +
                                                                   (long)(int)pfVar12[-3] * 4 +
                                                                   lVar14)),0x10);
                          auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)((long)local_c0 +
                                                                           (long)(int)pfVar12[-2] *
                                                                           4 + lVar14)),0x20);
                          auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)((long)local_c0 +
                                                                           (long)(int)pfVar12[-1] *
                                                                           4 + lVar14)),0x30);
                          auVar30._0_4_ = auVar23._0_4_ * *pfVar12;
                          auVar30._4_4_ = auVar23._4_4_ * pfVar12[1];
                          auVar30._8_4_ = auVar23._8_4_ * pfVar12[2];
                          auVar30._12_4_ = auVar23._12_4_ * pfVar12[3];
                          auVar23 = vhaddps_avx(auVar30,auVar30);
                          auVar23 = vhaddps_avx(auVar23,auVar23);
                          fVar31 = fVar31 + auVar23._0_4_;
                          pfVar12 = pfVar12 + 8;
                          iVar19 = iVar19 + -1;
                        } while (iVar19 != 0);
                      }
                      iVar21 = iVar21 + 1;
                      iVar20 = iVar20 + iVar16;
                    } while (iVar21 != local_104);
                    iVar17 = iVar17 + local_100;
                    this = local_88;
                  }
                  *(float *)(local_e8._0_8_ + lVar15 * 4) = fVar31 * (1.0 / (float)iVar10);
                  lVar15 = lVar15 + 1;
                  iVar20 = *(int *)(&this->field_0xd0 + (long)pp_Var5[-3]);
                } while (lVar15 < iVar20);
              }
              local_e8._0_8_ = local_e8._0_8_ + (long)iVar20 * 4;
              iVar20 = local_fc + 1;
            } while (local_fc + 1 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]));
          }
          local_f8 = (void *)((long)local_f8 + 1);
        } while (local_f8 != local_f0);
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var11) != 0) {
        return 0;
      }
      auVar25 = vroundps_avx(local_b8,10);
      auVar28._8_8_ = 0x4330000000000000;
      auVar28._0_8_ = 0x4330000000000000;
      auVar23 = vorpd_avx(ZEXT416(*(uint *)(&this->field_0xdc + (long)p_Var11)),auVar28);
      auVar23 = vsubpd_avx(auVar23,auVar28);
      auVar23 = vcvtpd2ps_avx(auVar23);
      auVar23 = vmovsldup_avx(auVar23);
      auVar29 = vpshufd_avx(ZEXT116(0 < *(int *)(&this->field_0xdc + (long)p_Var11)),0x50);
      auVar29 = vpslld_avx(auVar29,0x1f);
      auVar23 = vblendvps_avx(auVar25,auVar23,auVar29);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)*(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) * (long)(int)auVar23._4_4_ *
                 (long)*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) * (long)(int)auVar23._0_4_,
                 &local_105);
      p_Var11 = this->_vptr_ROIAlign_x86_avx[-3];
      auVar23 = vmovshdup_avx(local_b8);
      auVar29 = vmovshdup_avx(local_a8);
      fVar31 = auVar29._0_4_;
      fVar32 = auVar23._0_4_;
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar16,iVar10,*(int *)(&this->field_0xd4 + (long)p_Var11),
                 *(int *)(&this->field_0xd0 + (long)p_Var11),fVar31,(float)local_a8._0_4_,fVar32,
                 local_b8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var11),&pre_calc);
      if (0 < (int)local_f0) {
        auVar24._0_4_ = (float)iVar16;
        auVar24._4_12_ = auVar35;
        auVar27._0_4_ = (float)iVar10;
        auVar27._4_12_ = auVar35;
        local_c0 = this->_vptr_ROIAlign_x86_avx;
        pvVar6 = pMVar4->data;
        sVar7 = pMVar4->cstep;
        sVar8 = pMVar4->elemsize;
        local_d0 = (void *)0x0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)local_c0[-3])) {
            lVar14 = sVar7 * sVar8 * (long)local_d0;
            local_f8 = (void *)(local_90->cstep * (long)local_d0 * local_90->elemsize +
                               (long)local_90->data);
            uVar18 = 0;
            iVar10 = 0;
            do {
              p_Var11 = local_c0[-3];
              iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var11);
              iVar13 = (int)uVar18;
              if (0 < iVar16) {
                auVar23 = vmaxss_avx(ZEXT416((uint)(fVar31 + fVar32 * (float)iVar13)),
                                     ZEXT816(0) << 0x40);
                auVar29 = vminss_avx(auVar24,auVar23);
                auVar23 = vmaxss_avx(ZEXT416((uint)(fVar31 + fVar32 * (float)(iVar13 + 1))),
                                     ZEXT816(0) << 0x40);
                auVar23 = vminss_avx(auVar24,auVar23);
                fVar33 = auVar29._0_4_;
                fVar34 = auVar23._0_4_;
                auVar23 = vroundss_avx(ZEXT416((uint)(fVar34 - fVar33)),
                                       ZEXT416((uint)(fVar34 - fVar33)),10);
                lVar15 = 0;
                do {
                  iVar16 = *(int *)(&this->field_0xdc + (long)p_Var11);
                  fVar38 = (float)iVar16;
                  lVar1 = lVar15 + 1;
                  fVar40 = fVar38;
                  if (iVar16 < 1) {
                    fVar40 = auVar23._0_4_;
                  }
                  auVar36._0_12_ = ZEXT812(0);
                  auVar36._12_4_ = 0;
                  auVar37 = ZEXT1664(auVar36);
                  auVar29 = vmaxss_avx(ZEXT416((uint)((float)local_a8._0_4_ +
                                                     (float)local_b8._0_4_ * (float)(int)lVar15)),
                                       auVar36);
                  auVar25 = vminss_avx(auVar29,auVar27);
                  auVar29 = vmaxss_avx(ZEXT416((uint)((float)local_a8._0_4_ +
                                                     (float)local_b8._0_4_ * (float)(int)lVar1)),
                                       auVar36);
                  auVar29 = vminss_avx(auVar29,auVar27);
                  fVar41 = auVar25._0_4_;
                  fVar42 = auVar29._0_4_;
                  if (iVar16 < 1) {
                    auVar29 = vroundss_avx(ZEXT416((uint)(fVar42 - fVar41)),
                                           ZEXT416((uint)(fVar42 - fVar41)),10);
                    fVar38 = auVar29._0_4_;
                  }
                  iVar20 = (int)fVar40;
                  iVar16 = (int)fVar38;
                  if (0 < iVar20) {
                    local_fc = CONCAT31(local_fc._1_3_,fVar42 <= fVar41);
                    local_100 = CONCAT31(local_100._1_3_,fVar34 <= fVar33);
                    local_e8._0_8_ = lVar1;
                    iVar21 = 0;
                    iVar17 = 0;
                    if (0 < iVar16) {
                      iVar17 = iVar16;
                    }
                    iVar19 = iVar10;
                    do {
                      if (0 < iVar16) {
                        pfVar12 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar19].w1;
                        iVar9 = iVar16;
                        do {
                          auVar29 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar12 + -4))->pos1 * 4 +
                                                                   lVar14)),
                                                  ZEXT416(*(uint *)((long)pvVar6 +
                                                                   (long)(int)pfVar12[-3] * 4 +
                                                                   lVar14)),0x10);
                          auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)((long)pvVar6 +
                                                                           (long)(int)pfVar12[-2] *
                                                                           4 + lVar14)),0x20);
                          auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)((long)pvVar6 +
                                                                           (long)(int)pfVar12[-1] *
                                                                           4 + lVar14)),0x30);
                          auVar39._0_4_ = auVar29._0_4_ * *pfVar12;
                          auVar39._4_4_ = auVar29._4_4_ * pfVar12[1];
                          auVar39._8_4_ = auVar29._8_4_ * pfVar12[2];
                          auVar39._12_4_ = auVar29._12_4_ * pfVar12[3];
                          auVar29 = vhaddps_avx(auVar39,auVar39);
                          auVar29 = vhaddps_avx(auVar29,auVar29);
                          auVar37 = ZEXT464((uint)(auVar37._0_4_ + auVar29._0_4_));
                          pfVar12 = pfVar12 + 8;
                          iVar9 = iVar9 + -1;
                        } while (iVar9 != 0);
                      }
                      auVar36 = auVar37._0_16_;
                      iVar21 = iVar21 + 1;
                      iVar19 = iVar19 + iVar17;
                    } while (iVar21 != iVar20);
                    this = local_88;
                    local_104 = iVar10;
                    iVar10 = iVar10 + iVar17 * iVar20;
                  }
                  fVar38 = 0.0;
                  if (fVar34 > fVar33 && fVar42 > fVar41) {
                    fVar38 = auVar36._0_4_ / (float)(iVar20 * iVar16);
                  }
                  *(float *)((long)local_f8 + lVar15 * 4) = fVar38;
                  p_Var11 = local_c0[-3];
                  iVar16 = *(int *)(&this->field_0xd0 + (long)p_Var11);
                  lVar15 = lVar1;
                  local_c8 = uVar18;
                } while (lVar1 < iVar16);
              }
              local_f8 = (void *)((long)local_f8 + (long)iVar16 * 4);
              uVar18 = (ulong)(iVar13 + 1U);
            } while ((int)(iVar13 + 1U) < *(int *)(&this->field_0xd4 + (long)local_c0[-3]));
          }
          local_d0 = (void *)((long)local_d0 + 1);
        } while (local_d0 != local_f0);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int ROIAlign_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}